

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_common.c
# Opt level: O2

void stringcache_destroy(StringCache *cache)

{
  StringBucket **__ptr;
  StringBucket *pSVar1;
  StringBucket *__ptr_00;
  ulong uVar2;
  
  if (cache != (StringCache *)0x0) {
    for (uVar2 = 0; __ptr = cache->hashtable, uVar2 < cache->table_size; uVar2 = uVar2 + 1) {
      __ptr_00 = __ptr[uVar2];
      __ptr[uVar2] = (StringBucket *)0x0;
      while (__ptr_00 != (StringBucket *)0x0) {
        pSVar1 = __ptr_00->next;
        free(__ptr_00);
        __ptr_00 = pSVar1;
      }
    }
    free(__ptr);
    free(cache);
    return;
  }
  return;
}

Assistant:

void stringcache_destroy(StringCache *cache)
{
    size_t i;

    if (cache == NULL)
        return;

    for (i = 0; i < cache->table_size; i++)
    {
        StringBucket *bucket = cache->hashtable[i];
        cache->hashtable[i] = NULL;
        while (bucket)
        {
            StringBucket *next = bucket->next;
            free(bucket);
            bucket = next;
        } // while
    } // for

    free(cache->hashtable);
    free(cache);
}